

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPM2B_CREATION_DATA_Unmarshal(TPM2B_CREATION_DATA *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  INT32 startSize;
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPM2B_CREATION_DATA *target_local;
  
  target_local._4_4_ = UINT16_Unmarshal(&target->size,buffer,size);
  if (target_local._4_4_ == 0) {
    if (target->size == 0) {
      target_local._4_4_ = 0x95;
    }
    else {
      iVar1 = *size;
      target_local._4_4_ = TPMS_CREATION_DATA_Unmarshal(&target->creationData,buffer,size);
      if (target_local._4_4_ == 0) {
        if ((uint)target->size == iVar1 - *size) {
          target_local._4_4_ = 0;
        }
        else {
          target_local._4_4_ = 0x95;
        }
      }
    }
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPM2B_CREATION_DATA_Unmarshal(TPM2B_CREATION_DATA *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    INT32    startSize;
    result = UINT16_Unmarshal((UINT16 *)&(target->size), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    // if size is zero, then the required structure is missing
    if(target->size == 0)
        return TPM_RC_SIZE;
    startSize = *size;
    result = TPMS_CREATION_DATA_Unmarshal((TPMS_CREATION_DATA *)&(target->creationData), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if(target->size != (startSize - *size)) return TPM_RC_SIZE;
    return TPM_RC_SUCCESS;
}